

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssvectorbase.h
# Opt level: O3

void __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::~SSVectorBase(SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *this)

{
  int *__ptr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  pointer pnVar1;
  
  (this->super_IdxSet)._vptr_IdxSet = (_func_int **)&PTR__SSVectorBase_006a6970;
  __ptr = (this->super_IdxSet).idx;
  if (__ptr != (int *)0x0) {
    free(__ptr);
    (this->super_IdxSet).idx = (int *)0x0;
  }
  this_00 = (this->_tolerances).super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  (this->super_IdxSet)._vptr_IdxSet = (_func_int **)&PTR__IdxSet_0069d6f8;
  if ((this->super_IdxSet).freeArray == true) {
    free((this->super_IdxSet).idx);
    (this->super_IdxSet).idx = (int *)0x0;
  }
  pnVar1 = (this->
           super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).val.
           super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pnVar1 != (pointer)0x0) {
    operator_delete(pnVar1,(long)(this->
                                 super_VectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                                 ).val.
                                 super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pnVar1);
    return;
  }
  return;
}

Assistant:

~SSVectorBase()
   {
      if(idx)
         spx_free(idx);
   }